

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32_t *value)

{
  bool bVar1;
  uint32_t *buffer;
  uint8_t bytes [4];
  uint32_t local_14;
  
  buffer = *(uint32_t **)this;
  if (*(int *)(this + 8) - (int)buffer < 4) {
    buffer = &local_14;
    bVar1 = ReadRaw(this,buffer,4);
    if (!bVar1) {
      return false;
    }
  }
  else {
    *(uint32_t **)this = buffer + 1;
  }
  *value = *buffer;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}